

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O2

IVec3 __thiscall tcu::getBlockPixelSize(tcu *this,CompressedTexFormat format)

{
  undefined8 uVar1;
  int in_EDX;
  int extraout_EDX;
  IVec3 IVar2;
  
  if (format < COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA) {
switchD_00915684_caseD_b:
    uVar1 = 0x400000004;
  }
  else {
    switch(format) {
    case COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA:
    case COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8:
      goto switchD_00915684_caseD_b;
    case COMPRESSEDTEXFORMAT_ASTC_5x4_RGBA:
    case COMPRESSEDTEXFORMAT_ASTC_5x4_SRGB8_ALPHA8:
      uVar1 = 0x400000005;
      break;
    case COMPRESSEDTEXFORMAT_ASTC_5x5_RGBA:
    case COMPRESSEDTEXFORMAT_ASTC_5x5_SRGB8_ALPHA8:
      uVar1 = 0x500000005;
      break;
    case COMPRESSEDTEXFORMAT_ASTC_6x5_RGBA:
    case COMPRESSEDTEXFORMAT_ASTC_6x5_SRGB8_ALPHA8:
      uVar1 = 0x500000006;
      break;
    case COMPRESSEDTEXFORMAT_ASTC_6x6_RGBA:
    case COMPRESSEDTEXFORMAT_ASTC_6x6_SRGB8_ALPHA8:
      uVar1 = 0x600000006;
      break;
    case COMPRESSEDTEXFORMAT_ASTC_8x5_RGBA:
    case COMPRESSEDTEXFORMAT_ASTC_8x5_SRGB8_ALPHA8:
      uVar1 = 0x500000008;
      break;
    case COMPRESSEDTEXFORMAT_ASTC_8x6_RGBA:
    case COMPRESSEDTEXFORMAT_ASTC_8x6_SRGB8_ALPHA8:
      uVar1 = 0x600000008;
      break;
    case COMPRESSEDTEXFORMAT_ASTC_8x8_RGBA:
    case COMPRESSEDTEXFORMAT_ASTC_8x8_SRGB8_ALPHA8:
      uVar1 = 0x800000008;
      break;
    case COMPRESSEDTEXFORMAT_ASTC_10x5_RGBA:
    case COMPRESSEDTEXFORMAT_ASTC_10x5_SRGB8_ALPHA8:
      uVar1 = 0x50000000a;
      break;
    case COMPRESSEDTEXFORMAT_ASTC_10x6_RGBA:
    case COMPRESSEDTEXFORMAT_ASTC_10x6_SRGB8_ALPHA8:
      uVar1 = 0x60000000a;
      break;
    case COMPRESSEDTEXFORMAT_ASTC_10x8_RGBA:
    case COMPRESSEDTEXFORMAT_ASTC_10x8_SRGB8_ALPHA8:
      uVar1 = 0x80000000a;
      break;
    case COMPRESSEDTEXFORMAT_ASTC_10x10_RGBA:
    case COMPRESSEDTEXFORMAT_ASTC_10x10_SRGB8_ALPHA8:
      uVar1 = 0xa0000000a;
      break;
    case COMPRESSEDTEXFORMAT_ASTC_12x10_RGBA:
    case COMPRESSEDTEXFORMAT_ASTC_12x10_SRGB8_ALPHA8:
      uVar1 = 0xa0000000c;
      break;
    case COMPRESSEDTEXFORMAT_ASTC_12x12_RGBA:
    case COMPRESSEDTEXFORMAT_ASTC_12x12_SRGB8_ALPHA8:
      uVar1 = 0xc0000000c;
      break;
    default:
      Vector<int,_3>::Vector((Vector<int,_3> *)this,-1);
      in_EDX = extraout_EDX;
      goto LAB_0091569d;
    }
  }
  *(undefined8 *)this = uVar1;
  *(undefined4 *)(this + 8) = 1;
LAB_0091569d:
  IVar2.m_data[2] = in_EDX;
  IVar2.m_data._0_8_ = this;
  return (IVec3)IVar2.m_data;
}

Assistant:

IVec3 getBlockPixelSize (CompressedTexFormat format)
{
	if (isEtcFormat(format))
	{
		return IVec3(4, 4, 1);
	}
	else if (isAstcFormat(format))
	{
		switch (format)
		{
			case COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA:				return IVec3(4,  4,  1);
			case COMPRESSEDTEXFORMAT_ASTC_5x4_RGBA:				return IVec3(5,  4,  1);
			case COMPRESSEDTEXFORMAT_ASTC_5x5_RGBA:				return IVec3(5,  5,  1);
			case COMPRESSEDTEXFORMAT_ASTC_6x5_RGBA:				return IVec3(6,  5,  1);
			case COMPRESSEDTEXFORMAT_ASTC_6x6_RGBA:				return IVec3(6,  6,  1);
			case COMPRESSEDTEXFORMAT_ASTC_8x5_RGBA:				return IVec3(8,  5,  1);
			case COMPRESSEDTEXFORMAT_ASTC_8x6_RGBA:				return IVec3(8,  6,  1);
			case COMPRESSEDTEXFORMAT_ASTC_8x8_RGBA:				return IVec3(8,  8,  1);
			case COMPRESSEDTEXFORMAT_ASTC_10x5_RGBA:			return IVec3(10, 5,  1);
			case COMPRESSEDTEXFORMAT_ASTC_10x6_RGBA:			return IVec3(10, 6,  1);
			case COMPRESSEDTEXFORMAT_ASTC_10x8_RGBA:			return IVec3(10, 8,  1);
			case COMPRESSEDTEXFORMAT_ASTC_10x10_RGBA:			return IVec3(10, 10, 1);
			case COMPRESSEDTEXFORMAT_ASTC_12x10_RGBA:			return IVec3(12, 10, 1);
			case COMPRESSEDTEXFORMAT_ASTC_12x12_RGBA:			return IVec3(12, 12, 1);
			case COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8:		return IVec3(4,  4,  1);
			case COMPRESSEDTEXFORMAT_ASTC_5x4_SRGB8_ALPHA8:		return IVec3(5,  4,  1);
			case COMPRESSEDTEXFORMAT_ASTC_5x5_SRGB8_ALPHA8:		return IVec3(5,  5,  1);
			case COMPRESSEDTEXFORMAT_ASTC_6x5_SRGB8_ALPHA8:		return IVec3(6,  5,  1);
			case COMPRESSEDTEXFORMAT_ASTC_6x6_SRGB8_ALPHA8:		return IVec3(6,  6,  1);
			case COMPRESSEDTEXFORMAT_ASTC_8x5_SRGB8_ALPHA8:		return IVec3(8,  5,  1);
			case COMPRESSEDTEXFORMAT_ASTC_8x6_SRGB8_ALPHA8:		return IVec3(8,  6,  1);
			case COMPRESSEDTEXFORMAT_ASTC_8x8_SRGB8_ALPHA8:		return IVec3(8,  8,  1);
			case COMPRESSEDTEXFORMAT_ASTC_10x5_SRGB8_ALPHA8:	return IVec3(10, 5,  1);
			case COMPRESSEDTEXFORMAT_ASTC_10x6_SRGB8_ALPHA8:	return IVec3(10, 6,  1);
			case COMPRESSEDTEXFORMAT_ASTC_10x8_SRGB8_ALPHA8:	return IVec3(10, 8,  1);
			case COMPRESSEDTEXFORMAT_ASTC_10x10_SRGB8_ALPHA8:	return IVec3(10, 10, 1);
			case COMPRESSEDTEXFORMAT_ASTC_12x10_SRGB8_ALPHA8:	return IVec3(12, 10, 1);
			case COMPRESSEDTEXFORMAT_ASTC_12x12_SRGB8_ALPHA8:	return IVec3(12, 12, 1);

			default:
				DE_ASSERT(false);
				return IVec3();
		}
	}
	else
	{
		DE_ASSERT(false);
		return IVec3(-1);
	}
}